

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attrs.c
# Opt level: O2

void prvTidyFreeAttrTable(TidyDocImpl *doc)

{
  _AttrHash *p_Var1;
  Attribute *pAVar2;
  ctmbstr s;
  uint uVar3;
  int iVar4;
  _AttrHash **pp_Var5;
  AttrHash **ppAVar6;
  AttrHash *pAVar7;
  uint i;
  long lVar8;
  AttrHash *pAVar9;
  
  for (lVar8 = 0; lVar8 != 0xb2; lVar8 = lVar8 + 1) {
    pAVar7 = (doc->attribs).hashtab[lVar8];
    while (pAVar7 != (AttrHash *)0x0) {
      p_Var1 = pAVar7->next;
      (*doc->allocator->vtbl->free)(doc->allocator,pAVar7);
      pAVar7 = p_Var1;
    }
    (doc->attribs).hashtab[lVar8] = (AttrHash *)0x0;
  }
  prvTidyFreeAnchors(doc);
  do {
    pAVar2 = (doc->attribs).declared_attr_list;
    if (pAVar2 == (Attribute *)0x0) {
      return;
    }
    (doc->attribs).declared_attr_list = pAVar2->next;
    s = pAVar2->name;
    uVar3 = attrsHash(s);
    ppAVar6 = (doc->attribs).hashtab + uVar3;
    pp_Var5 = ppAVar6;
    pAVar7 = (AttrHash *)0x0;
    do {
      pAVar9 = pAVar7;
      pAVar7 = *pp_Var5;
      if ((pAVar7 == (AttrHash *)0x0) || (pAVar7->attr == (Attribute *)0x0)) goto LAB_0013c32e;
      iVar4 = prvTidytmbstrcmp(s,pAVar7->attr->name);
      pp_Var5 = &pAVar7->next;
    } while (iVar4 != 0);
    pp_Var5 = &pAVar9->next;
    if (pAVar9 == (AttrHash *)0x0) {
      pp_Var5 = ppAVar6;
    }
    *pp_Var5 = pAVar7->next;
    (*doc->allocator->vtbl->free)(doc->allocator,pAVar7);
LAB_0013c32e:
    (*doc->allocator->vtbl->free)(doc->allocator,pAVar2->name);
    (*doc->allocator->vtbl->free)(doc->allocator,pAVar2);
  } while( true );
}

Assistant:

void TY_(FreeAttrTable)( TidyDocImpl* doc )
{
    attrsEmptyHash( doc, &doc->attribs );
    TY_(FreeAnchors)( doc );
    FreeDeclaredAttributes( doc );
}